

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageCharUp(gdImagePtr im,gdFontPtr f,int x,int y,int c,int color)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int y_00;
  
  iVar1 = f->offset;
  if ((iVar1 <= c) && (c < iVar1 + f->nchars)) {
    iVar5 = f->w;
    if (0 < iVar5) {
      iVar2 = f->h;
      iVar4 = iVar2 * iVar5;
      iVar6 = 0;
      y_00 = y;
      do {
        if (0 < iVar2) {
          iVar5 = 0;
          do {
            if (f->data[f->w * iVar5 + iVar6 + iVar4 * (c - iVar1)] != '\0') {
              gdImageSetPixel(im,x + iVar5,y_00,color);
              iVar2 = f->h;
            }
            iVar3 = x + iVar5;
            iVar5 = iVar5 + 1;
          } while (iVar3 + 1 < iVar2 + x);
          iVar5 = f->w;
        }
        iVar6 = iVar6 + 1;
        y_00 = y_00 + -1;
      } while (y - iVar5 < y_00);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageCharUp (gdImagePtr im, gdFontPtr f, int x, int y, int c, int color)
{
	int cx, cy;
	int px, py;
	int fline;
	cx = 0;
	cy = 0;
#ifdef CHARSET_EBCDIC
	c = ASC (c);
#endif /*CHARSET_EBCDIC */
	if ((c < f->offset) || (c >= (f->offset + f->nchars))) {
		return;
	}
	fline = (c - f->offset) * f->h * f->w;
	for (py = y; (py > (y - f->w)); py--) {
		for (px = x; (px < (x + f->h)); px++) {
			if (f->data[fline + cy * f->w + cx]) {
				gdImageSetPixel (im, px, py, color);
			}
			cy++;
		}
		cy = 0;
		cx++;
	}
}